

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QDockWidgetGroupWindow::hasNativeDecos(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  QDockWidget *pQVar2;
  QWidget *pQVar3;
  QDockWidget *in_RDI;
  QDockWidget *dw;
  QDockWidgetGroupWindow *in_stack_00000028;
  undefined1 local_1;
  
  pQVar2 = activeTabbedDockWidget(in_stack_00000028);
  if (pQVar2 == (QDockWidget *)0x0) {
    local_1 = true;
  }
  else {
    bVar1 = QDockWidgetLayout::wmSupportsNativeWindowDeco();
    if (bVar1) {
      pQVar3 = QDockWidget::titleBarWidget(in_RDI);
      local_1 = pQVar3 == (QWidget *)0x0;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool QDockWidgetGroupWindow::hasNativeDecos() const
{
#if QT_CONFIG(tabbar)
    QDockWidget *dw = activeTabbedDockWidget();
    if (!dw) // We have a group of nested QDockWidgets (not just floating tabs)
        return true;

    if (!QDockWidgetLayout::wmSupportsNativeWindowDeco())
        return false;

    return dw->titleBarWidget() == nullptr;
#else
    return true;
#endif
}